

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall
cs_impl::any::holder<cs::type_t>::holder<std::function<cs_impl::any()>const&,std::type_index_const&>
          (holder<cs::type_t> *this,function<cs_impl::any_()> *args,type_index *args_1)

{
  type_id local_48;
  function<cs_impl::any_()> local_38;
  
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_0024a9b0;
  std::function<cs_impl::any_()>::function(&local_38,args);
  local_48.type_idx = (type_index)args_1->_M_target;
  local_48.type_hash = 0;
  cs::type_t::type_t(&this->mDat,&local_38,&local_48);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}